

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServer.cxx
# Opt level: O0

void __thiscall cmDebugServer::Broadcast(cmDebugServer *this,string *msg)

{
  bool bVar1;
  uint uVar2;
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  *this_00;
  reference this_01;
  pointer pcVar3;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *connection;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  *__range1;
  string *msg_local;
  cmDebugServer *this_local;
  
  uv_rwlock_rdlock(&(this->super_cmServerBase).ConnectionsMutex);
  this_00 = &(this->super_cmServerBase).Connections;
  __end1 = std::
           vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ::begin(this_00);
  connection = (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
               std::
               vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
               ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
                                     *)&connection), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
              ::operator*(&__end1);
    pcVar3 = std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>::operator->(this_01);
    uVar2 = (*pcVar3->_vptr_cmConnection[4])();
    if ((uVar2 & 1) != 0) {
      pcVar3 = std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>::operator->
                         (this_01);
      (**pcVar3->_vptr_cmConnection)(pcVar3,msg);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
    ::operator++(&__end1);
  }
  uv_rwlock_rdunlock(&(this->super_cmServerBase).ConnectionsMutex);
  return;
}

Assistant:

void cmDebugServer::Broadcast(const std::string& msg)
{
  uv_rwlock_rdlock(&ConnectionsMutex);
  for (auto& connection : Connections) {
    if (connection->IsOpen()) {
      connection->WriteData(msg);
    }
  }
  uv_rwlock_rdunlock(&ConnectionsMutex);
}